

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::EnumGenerator::GenerateDefinition
          (EnumGenerator *this,Printer *printer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Syntax SVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  EnumValueDescriptor *pEVar5;
  FileDescriptor *pFVar6;
  Formatter *in_RDI;
  Formatter format_value;
  int i;
  EnumValueDescriptor *max_value;
  EnumValueDescriptor *min_value;
  Formatter format;
  Options *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  undefined1 in_stack_fffffffffffffd57;
  Options *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  string *in_stack_fffffffffffffd68;
  Formatter *in_stack_fffffffffffffd70;
  EnumValueOptions *in_stack_fffffffffffffdc8;
  int number;
  allocator *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  Formatter *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  Formatter *args;
  char *in_stack_fffffffffffffe38;
  Formatter *in_stack_fffffffffffffe40;
  string local_1a8 [32];
  EnumValueDescriptor *local_188;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [92];
  int local_6c;
  EnumValueDescriptor *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [2];
  
  args_1 = local_48;
  Formatter::Formatter
            ((Formatter *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             (Printer *)in_stack_fffffffffffffd28,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x55faa8);
  Formatter::operator()
            (in_stack_fffffffffffffdf0,
             (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
             (EnumDescriptor **)in_stack_fffffffffffffde0);
  Formatter::Indent((Formatter *)0x55fad3);
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,0);
  local_60 = args_2;
  local_68 = EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,0);
  local_6c = 0;
  while( true ) {
    iVar3 = local_6c;
    number = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
    iVar2 = EnumDescriptor::value_count((EnumDescriptor *)in_RDI->printer_);
    if (iVar2 <= iVar3) break;
    Formatter::Formatter
              ((Formatter *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (Formatter *)in_stack_fffffffffffffd28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"name",&local_c9);
    EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    EnumValueName_abi_cxx11_((EnumValueDescriptor *)in_stack_fffffffffffffd58);
    Formatter::Set<std::__cxx11::string>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"number",&local_111);
    in_stack_fffffffffffffdf0 =
         (Formatter *)EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    in_stack_fffffffffffffdec =
         EnumValueDescriptor::number((EnumValueDescriptor *)in_stack_fffffffffffffdf0);
    Int32ToString_abi_cxx11_(number);
    Formatter::Set<std::__cxx11::string>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    in_stack_fffffffffffffde0 = &local_159;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"deprecation",in_stack_fffffffffffffde0);
    pEVar5 = EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    in_stack_fffffffffffffdc8 = EnumValueDescriptor::options(pEVar5);
    EnumValueOptions::deprecated((EnumValueOptions *)0x55fd87);
    DeprecatedAttribute_abi_cxx11_(in_stack_fffffffffffffd58,(bool)in_stack_fffffffffffffd57);
    Formatter::Set<std::__cxx11::string>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    if (0 < local_6c) {
      Formatter::operator()<>(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    }
    local_188 = EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    Formatter::operator()
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (EnumValueDescriptor **)in_stack_fffffffffffffde0);
    pEVar5 = EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    iVar3 = EnumValueDescriptor::number(pEVar5);
    iVar2 = EnumValueDescriptor::number((EnumValueDescriptor *)local_60);
    if (iVar3 < iVar2) {
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    }
    pEVar5 = EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    iVar3 = EnumValueDescriptor::number(pEVar5);
    iVar2 = EnumValueDescriptor::number(local_68);
    if (iVar2 < iVar3) {
      local_68 = EnumDescriptor::value((EnumDescriptor *)in_RDI->printer_,local_6c);
    }
    Formatter::~Formatter((Formatter *)0x5600f7);
    local_6c = local_6c + 1;
  }
  pFVar6 = EnumDescriptor::file((EnumDescriptor *)in_RDI->printer_);
  SVar4 = FileDescriptor::syntax(pFVar6);
  if (SVar4 == SYNTAX_PROTO3) {
    iVar3 = EnumDescriptor::value_count((EnumDescriptor *)in_RDI->printer_);
    if (0 < iVar3) {
      Formatter::operator()<>(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
    }
    Formatter::operator()<>(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  }
  Formatter::Outdent((Formatter *)0x5601ab);
  Formatter::operator()<>(in_stack_fffffffffffffd70,(char *)in_stack_fffffffffffffd68);
  args = in_RDI;
  EnumValueName_abi_cxx11_((EnumValueDescriptor *)in_stack_fffffffffffffd58);
  EnumValueName_abi_cxx11_((EnumValueDescriptor *)in_stack_fffffffffffffd58);
  Formatter::operator()
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(EnumDescriptor **)args,args_1,
             args_2);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  std::__cxx11::string::~string(local_1a8);
  if (((args->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) != 0) {
    Formatter::operator()
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
               (EnumDescriptor **)in_stack_fffffffffffffde0);
  }
  pFVar6 = EnumDescriptor::file((EnumDescriptor *)args->printer_);
  bVar1 = HasDescriptorMethods
                    ((FileDescriptor *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)
                     ,in_stack_fffffffffffffd28);
  if (bVar1) {
    Formatter::operator()<>(in_RDI,(char *)pFVar6);
  }
  EnumDescriptor::file((EnumDescriptor *)args->printer_);
  bVar1 = HasDescriptorMethods
                    ((FileDescriptor *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)
                     ,in_stack_fffffffffffffd28);
  if (!bVar1) {
    Formatter::operator()<>(in_RDI,(char *)pFVar6);
  }
  Formatter::operator()<>(in_RDI,(char *)pFVar6);
  EnumDescriptor::file((EnumDescriptor *)args->printer_);
  bVar1 = HasDescriptorMethods
                    ((FileDescriptor *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)
                     ,in_stack_fffffffffffffd28);
  if (bVar1) {
    Formatter::operator()<>(in_RDI,(char *)pFVar6);
  }
  else {
    Formatter::operator()<>(in_RDI,(char *)pFVar6);
  }
  Formatter::operator()<>(in_RDI,(char *)pFVar6);
  EnumDescriptor::file((EnumDescriptor *)args->printer_);
  bVar1 = HasDescriptorMethods
                    ((FileDescriptor *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30)
                     ,in_stack_fffffffffffffd28);
  if (bVar1) {
    Formatter::operator()<>(in_RDI,(char *)pFVar6);
  }
  else {
    Formatter::operator()<>(in_RDI,(char *)pFVar6);
  }
  Formatter::~Formatter((Formatter *)0x560477);
  return;
}

Assistant:

void EnumGenerator::GenerateDefinition(io::Printer* printer) {
  Formatter format(printer, variables_);
  format("enum ${1$$classname$$}$ : int {\n", descriptor_);
  format.Indent();

  const EnumValueDescriptor* min_value = descriptor_->value(0);
  const EnumValueDescriptor* max_value = descriptor_->value(0);

  for (int i = 0; i < descriptor_->value_count(); i++) {
    auto format_value = format;
    format_value.Set("name", EnumValueName(descriptor_->value(i)));
    // In C++, an value of -2147483648 gets interpreted as the negative of
    // 2147483648, and since 2147483648 can't fit in an integer, this produces a
    // compiler warning.  This works around that issue.
    format_value.Set("number", Int32ToString(descriptor_->value(i)->number()));
    format_value.Set(
        "deprecation",
        DeprecatedAttribute(options_,
                            descriptor_->value(i)->options().deprecated()));

    if (i > 0) format_value(",\n");
    format_value("${1$$prefix$$name$$}$ $deprecation$= $number$",
                 descriptor_->value(i));

    if (descriptor_->value(i)->number() < min_value->number()) {
      min_value = descriptor_->value(i);
    }
    if (descriptor_->value(i)->number() > max_value->number()) {
      max_value = descriptor_->value(i);
    }
  }

  if (descriptor_->file()->syntax() == FileDescriptor::SYNTAX_PROTO3) {
    // For new enum semantics: generate min and max sentinel values equal to
    // INT32_MIN and INT32_MAX
    if (descriptor_->value_count() > 0) format(",\n");
    format(
        "$classname$_$prefix$INT_MIN_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::min(),\n"
        "$classname$_$prefix$INT_MAX_SENTINEL_DO_NOT_USE_ = "
        "std::numeric_limits<$int32$>::max()");
  }

  format.Outdent();
  format("\n};\n");

  format(
      "$dllexport_decl $bool $classname$_IsValid(int value);\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MIN$}$ = "
      "$prefix$$2$;\n"
      "constexpr $classname$ ${1$$prefix$$short_name$_MAX$}$ = "
      "$prefix$$3$;\n",
      descriptor_, EnumValueName(min_value), EnumValueName(max_value));

  if (generate_array_size_) {
    format(
        "constexpr int ${1$$prefix$$short_name$_ARRAYSIZE$}$ = "
        "$prefix$$short_name$_MAX + 1;\n\n",
        descriptor_);
  }

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "$dllexport_decl $const ::$proto_ns$::EnumDescriptor* "
        "$classname$_descriptor();\n");
  }

  // The _Name and _Parse functions. The lite implementation is table-based, so
  // we make sure to keep the tables hidden in the .cc file.
  if (!HasDescriptorMethods(descriptor_->file(), options_)) {
    format("const std::string& $classname$_Name($classname$ value);\n");
  }
  // The _Name() function accepts the enum type itself but also any integral
  // type.
  format(
      "template<typename T>\n"
      "inline const std::string& $classname$_Name(T enum_t_value) {\n"
      "  static_assert(::std::is_same<T, $classname$>::value ||\n"
      "    ::std::is_integral<T>::value,\n"
      "    \"Incorrect type passed to function $classname$_Name.\");\n");
  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "  return ::$proto_ns$::internal::NameOfEnum(\n"
        "    $classname$_descriptor(), enum_t_value);\n");
  } else {
    format(
        "  return $classname$_Name(static_cast<$classname$>(enum_t_value));\n");
  }
  format("}\n");

  if (HasDescriptorMethods(descriptor_->file(), options_)) {
    format(
        "inline bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value) {\n"
        "  return ::$proto_ns$::internal::ParseNamedEnum<$classname$>(\n"
        "    $classname$_descriptor(), name, value);\n"
        "}\n");
  } else {
    format(
        "bool $classname$_Parse(\n"
        "    const std::string& name, $classname$* value);\n");
  }
}